

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
* __thiscall
wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::findLiveBlocks
          (unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
           *__return_storage_ptr__,
          CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppBVar3;
  vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *this_00;
  reference ppBVar4;
  pair<std::__detail::_Node_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_true,_false>,_bool>
  pVar5;
  BasicBlock *local_c8;
  BasicBlock *out;
  iterator __end0;
  iterator __begin0;
  vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *__range3;
  BasicBlock *local_88;
  BasicBlock *curr;
  iterator iter;
  undefined1 local_58 [8];
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *this_local;
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *alive;
  
  queue._M_h._M_single_bucket._7_1_ = 0;
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::unordered_set(__return_storage_ptr__);
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::unordered_set((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   *)local_58);
  pVar5 = std::
          unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)local_58,&this->entry);
  iter.
  super__Node_iterator_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
  ._M_cur = (_Node_iterator_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
             )pVar5.first.
              super__Node_iterator_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
              ._M_cur;
  while (sVar2 = std::
                 unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::size((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                         *)local_58), sVar2 != 0) {
    curr = (BasicBlock *)
           std::
           unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
           ::begin((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)local_58);
    ppBVar3 = std::__detail::
              _Node_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_true,_false>
              ::operator*((_Node_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_true,_false>
                           *)&curr);
    local_88 = *ppBVar3;
    std::
    unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
             *)local_58,(iterator)curr);
    std::
    unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::insert(__return_storage_ptr__,&local_88);
    this_00 = &local_88->out;
    __end0 = std::
             vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ::begin(this_00);
    out = (BasicBlock *)
          std::
          vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                       *)&out), bVar1) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                ::operator*(&__end0);
      local_c8 = *ppBVar4;
      sVar2 = std::
              unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ::count(__return_storage_ptr__,&local_c8);
      if (sVar2 == 0) {
        std::
        unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  *)local_58,&local_c8);
      }
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
      ::operator++(&__end0);
    }
  }
  queue._M_h._M_single_bucket._7_1_ = 1;
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::~unordered_set((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)local_58);
  if ((queue._M_h._M_single_bucket._7_1_ & 1) == 0) {
    std::
    unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::~unordered_set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<BasicBlock*> findLiveBlocks() {
    std::unordered_set<BasicBlock*> alive;
    std::unordered_set<BasicBlock*> queue;
    queue.insert(entry);
    while (queue.size() > 0) {
      auto iter = queue.begin();
      auto* curr = *iter;
      queue.erase(iter);
      alive.insert(curr);
      for (auto* out : curr->out) {
        if (!alive.count(out)) {
          queue.insert(out);
        }
      }
    }
    return alive;
  }